

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_File.cpp
# Opt level: O0

uint64_t __thiscall axl::io::psx::File::getSize(File *this)

{
  int iVar1;
  int *in_RDI;
  int result;
  stat64 stat;
  stat64 local_a0;
  unsigned_long local_8;
  
  iVar1 = fstat64(*in_RDI,&local_a0);
  if (iVar1 == -1) {
    local_8 = err::failWithLastSystemError<unsigned_long>(0x1ae0aa);
  }
  else {
    local_8 = local_a0.st_size;
  }
  return local_8;
}

Assistant:

uint64_t
File::getSize() const {
#if (_AXL_OS_DARWIN)
	struct stat stat;
	int result = ::fstat(m_h, &stat);
#else
	struct stat64 stat;
	int result = ::fstat64(m_h, &stat);
#endif

	if (result == -1)
		return err::failWithLastSystemError<uint64_t>(-1);

	return stat.st_size;
}